

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::buffer<wchar_t>::append<wchar_t>(buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  type tVar1;
  size_t sVar2;
  wchar_t *__result;
  size_t new_size;
  wchar_t *end_local;
  wchar_t *begin_local;
  buffer<wchar_t> *this_local;
  
  sVar2 = this->size_;
  tVar1 = to_unsigned<long>((long)end - (long)begin >> 2);
  sVar2 = sVar2 + tVar1;
  reserve(this,sVar2);
  __result = make_checked<wchar_t>(this->ptr_ + this->size_,this->capacity_ - this->size_);
  std::uninitialized_copy<wchar_t_const*,wchar_t*>(begin,end,__result);
  this->size_ = sVar2;
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  size_t new_size = size_ + to_unsigned(end - begin);
  reserve(new_size);
  std::uninitialized_copy(begin, end,
                          make_checked(ptr_ + size_, capacity_ - size_));
  size_ = new_size;
}